

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<long_long>::appendInitialize(QArrayDataPointer<long_long> *this,qsizetype newSize)

{
  longlong *plVar1;
  long in_RSI;
  longlong *in_RDI;
  longlong *e;
  longlong *b;
  
  begin((QArrayDataPointer<long_long> *)0x733a10);
  plVar1 = begin((QArrayDataPointer<long_long> *)0x733a29);
  std::uninitialized_value_construct<long_long*>(plVar1 + in_RSI,in_RDI);
  in_RDI[2] = in_RSI;
  return;
}

Assistant:

void appendInitialize(qsizetype newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize > this->size);
        Q_ASSERT(newSize - this->size <= this->freeSpaceAtEnd());

        T *const b = this->begin() + this->size;
        T *const e = this->begin() + newSize;
        q17::uninitialized_value_construct(b, e);
        this->size = newSize;
    }